

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

mtree_entry_conflict * mtree_entry_find_child(mtree_entry_conflict *parent,char *child_name)

{
  mtree_entry_conflict *np;
  char *child_name_local;
  mtree_entry_conflict *parent_local;
  
  if (parent == (mtree_entry_conflict *)0x0) {
    parent_local = (mtree_entry_conflict *)0x0;
  }
  else {
    parent_local = (mtree_entry_conflict *)
                   __archive_rb_tree_find_node(&parent->dir_info->rbtree,child_name);
  }
  return parent_local;
}

Assistant:

static struct mtree_entry *
mtree_entry_find_child(struct mtree_entry *parent, const char *child_name)
{
	struct mtree_entry *np;

	if (parent == NULL)
		return (NULL);
	np = (struct mtree_entry *)__archive_rb_tree_find_node(
	    &(parent->dir_info->rbtree), child_name);
	return (np);
}